

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O1

VOID PAL_Reenter(PAL_Boundary boundary)

{
  CPalThread *pCVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    pCVar1 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pCVar1 == (CPalThread *)0x0) {
      pCVar1 = CreateCurrentThreadData();
    }
    if (pCVar1 == (CPalThread *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_Reenter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,0xa9);
      fprintf(_stderr,"PAL_Reenter called on a thread unknown to this PAL\n");
    }
    if (pCVar1->m_fInPal == true) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00333918;
    }
    else {
      pCVar1->m_fInPal = true;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
LAB_00333918:
  abort();
}

Assistant:

VOID
PALAPI
PAL_Reenter(PAL_Boundary boundary)
{
    ENTRY_EXTERNAL("PAL_Reenter(boundary=%u)\n", boundary);

    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread == NULL)
    {
        ASSERT("PAL_Reenter called on a thread unknown to this PAL\n");
    }

    // We ignore the return code.  This call should only fail on internal
    // error, and we assert at the actual failure.
    pThread->Enter(boundary);

    LOGEXIT("PAL_Reenter returns\n");
}